

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O3

bool __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Uint64(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,uint64_t u64)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  char *pcVar2;
  char *buffer;
  
  PrettyPrefix(this,kNumberType);
  this_00 = &((this->
              super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              ).os_)->stack_;
  buffer = this_00->stackTop_;
  if ((long)this_00->stackEnd_ - (long)buffer < 0x14) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x14);
    buffer = this_00->stackTop_;
  }
  this_00->stackTop_ = buffer + 0x14;
  pcVar2 = internal::u64toa(u64,buffer);
  pGVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).os_;
  (pGVar1->stack_).stackTop_ = pcVar2 + (long)((pGVar1->stack_).stackTop_ + (-0x14 - (long)buffer));
  return true;
}

Assistant:

bool Uint64(uint64_t u64)   { PrettyPrefix(kNumberType); return Base::EndValue(Base::WriteUint64(u64));  }